

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple_Generator.cc
# Opt level: O0

Triple __thiscall
Triple_Generator::triple_generator(Triple_Generator *this,uint32_t K,uint32_t X,uint32_t LP)

{
  uint32_t uVar1;
  ostream *this_00;
  RandNum_Generator *this_01;
  long lVar2;
  uint x;
  __type _Var3;
  uint32_t v;
  uint32_t Y;
  uint32_t B;
  uint32_t A;
  uint32_t LP_local;
  uint32_t X_local;
  uint32_t K_local;
  Triple_Generator *this_local;
  
  if (K < 4) {
    this_00 = std::operator<<((ostream *)&std::cerr,"K is must greater than or equal to 4");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  x = ((J[K - 4] * 0x281b + 0x281b) % (uint)this->Q +
      X * ((J[K - 4] * 0x3e5 + 0xd157) % (uint)this->Q)) % (uint)this->Q;
  this_01 = &this->rand;
  _Var3 = std::pow<int,int>(2,0x14);
  lVar2 = RandNum_Generator::generator(this_01,x,0,(int)(long)_Var3);
  uVar1 = Degree_Generator::deg_generator(&this->deg,(int)lVar2);
  (this->triple).d = uVar1;
  lVar2 = RandNum_Generator::generator(this_01,x,1,LP - 1);
  (this->triple).a = (int)lVar2 + 1;
  lVar2 = RandNum_Generator::generator(this_01,x,2,LP);
  (this->triple).b = (uint32_t)lVar2;
  return this->triple;
}

Assistant:

struct Triple Triple_Generator::triple_generator(uint32_t K, uint32_t X, uint32_t LP)
{
	uint32_t A = 0;
	uint32_t B = 0;
	uint32_t Y = 0;
	uint32_t v = 0;


	if (K < 4)
	{
		std::cerr << "K is must greater than or equal to 4" << std::endl;
		exit(-1);
	}

	K = K - 4;

	A = (53591 + J[K] * 997) % Q;
	B = (10267 * (J[K] + 1)) % Q;
	Y = (B + X * A) % Q;
	v = rand.generator(Y, 0, (uint32_t)pow(2, 20));
	triple.d = deg.deg_generator(v);
	triple.a = 1 + rand.generator(Y, 1, LP - 1);
	triple.b = rand.generator(Y, 2, LP);

//	printf(" J[K]: %d  A : %d B : %d Y : %d v : %d \n",J[K],A,B,Y,v);

	return triple;
}